

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O1

bool __thiscall duckdb::PivotColumn::Equals(PivotColumn *this,PivotColumn *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  size_t __n;
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong __n_00;
  
  bVar1 = ExpressionUtil::ListEquals(&this->pivot_expressions,&other->pivot_expressions);
  if (bVar1) {
    __first1 = (other->unpivot_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (other->unpivot_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (this->unpivot_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((((long)__last1 - (long)__first1 ==
           (long)(this->unpivot_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
         (bVar1 = ::std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (__first1,__last1,__first2), bVar1)) &&
        (__n = (other->pivot_enum)._M_string_length, __n == (this->pivot_enum)._M_string_length)) &&
       (((__n == 0 ||
         (iVar3 = bcmp((other->pivot_enum)._M_dataplus._M_p,(this->pivot_enum)._M_dataplus._M_p,__n)
         , iVar3 == 0)) &&
        ((long)(other->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(other->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_start ==
         (long)(this->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)))) {
      bVar1 = (this->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (bVar1) {
        return bVar1;
      }
      pvVar4 = vector<duckdb::PivotColumnEntry,_true>::operator[](&this->entries,0);
      pvVar5 = vector<duckdb::PivotColumnEntry,_true>::operator[](&other->entries,0);
      bVar2 = PivotColumnEntry::Equals(pvVar4,pvVar5);
      if (!bVar2) {
        return bVar1;
      }
      __n_00 = 1;
      do {
        bVar1 = (ulong)((long)(this->entries).
                              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              .
                              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->entries).
                              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              .
                              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 6) <= __n_00;
        if (bVar1) {
          return bVar1;
        }
        pvVar4 = vector<duckdb::PivotColumnEntry,_true>::operator[](&this->entries,__n_00);
        pvVar5 = vector<duckdb::PivotColumnEntry,_true>::operator[](&other->entries,__n_00);
        bVar2 = PivotColumnEntry::Equals(pvVar4,pvVar5);
        __n_00 = __n_00 + 1;
      } while (bVar2);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool PivotColumn::Equals(const PivotColumn &other) const {
	if (!ExpressionUtil::ListEquals(pivot_expressions, other.pivot_expressions)) {
		return false;
	}
	if (other.unpivot_names != unpivot_names) {
		return false;
	}
	if (other.pivot_enum != pivot_enum) {
		return false;
	}
	if (other.entries.size() != entries.size()) {
		return false;
	}
	for (idx_t i = 0; i < entries.size(); i++) {
		if (!entries[i].Equals(other.entries[i])) {
			return false;
		}
	}
	return true;
}